

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeRAW.cpp
# Opt level: O1

int __thiscall
FormatTypeRAW::LoadTrack
          (FormatTypeRAW *this,IDisk **created_disk,char *file_path,int side,int track)

{
  pointer paVar1;
  bool bVar2;
  undefined1 uVar3;
  uint uVar4;
  IDisk **ppIVar5;
  FILE *__stream;
  FluxElement *pFVar6;
  int iVar7;
  uint uVar8;
  byte bVar9;
  uchar c;
  uchar c_2;
  uchar c_3;
  uchar c_1;
  uchar c_6;
  uchar c_4;
  uchar c_5;
  byte local_47;
  undefined1 local_46;
  undefined1 local_45;
  byte local_44;
  byte local_43;
  undefined1 local_42;
  undefined1 local_41;
  uint local_40;
  uint local_3c;
  IDisk **local_38;
  
  this->last_stream_index_position_ = 0;
  this->finished_ = false;
  __stream = fopen(file_path,"rb");
  if (__stream == (FILE *)0x0) {
    iVar7 = -1;
  }
  else {
    this->stream_position_ = 0;
    this->size_of_flux_value_ = 0x1964;
    local_40 = side;
    local_3c = track;
    local_38 = created_disk;
    pFVar6 = (FluxElement *)operator_new__(52000);
    this->flux_list_ = pFVar6;
    this->nb_flux_value_ = 0;
    paVar1 = (this->index_list_).
             super__Vector_base<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->index_list_).
        super__Vector_base<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>
        ._M_impl.super__Vector_impl_data._M_finish != paVar1) {
      (this->index_list_).
      super__Vector_base<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>.
      _M_impl.super__Vector_impl_data._M_finish = paVar1;
    }
    this->stream_position_ = 1;
    fread(&local_47,1,1,__stream);
    if (this->finished_ == false) {
      uVar8 = 0;
      bVar2 = false;
      bVar9 = local_47;
      do {
        iVar7 = feof(__stream);
        if (iVar7 != 0) break;
        switch(bVar9) {
        case 0:
        case 1:
        case 2:
        case 3:
        case 4:
        case 5:
        case 6:
        case 7:
          if (!bVar2) {
            uVar8 = 0;
          }
          this->stream_position_ = this->stream_position_ + 1;
          fread(&local_44,1,1,__stream);
          uVar8 = (uint)bVar9 * 0x100 + uVar8 + (uint)local_44;
          InsertFluxValue(this,uVar8);
          bVar2 = false;
          break;
        case 8:
          break;
        case 10:
          this->stream_position_ = this->stream_position_ + 1;
          fread(&local_42,1,1,__stream);
        case 9:
          this->stream_position_ = this->stream_position_ + 1;
          fread(&local_41,1,1,__stream);
          break;
        case 0xb:
          uVar8 = uVar8 + 0x10000;
          bVar2 = true;
          break;
        case 0xc:
          if (!bVar2) {
            uVar8 = 0;
          }
          this->stream_position_ = this->stream_position_ + 1;
          fread(&local_46,1,1,__stream);
          uVar3 = local_46;
          this->stream_position_ = this->stream_position_ + 1;
          fread(&local_45,1,1,__stream);
          uVar8 = uVar8 + CONCAT11(uVar3,local_45);
          goto LAB_00146aa0;
        case 0xd:
          this->stream_position_ = this->stream_position_ - 1;
          HandleOOB(this,(FILE *)__stream);
          break;
        default:
          if (!bVar2) {
            uVar8 = 0;
          }
          uVar8 = uVar8 + bVar9;
LAB_00146aa0:
          InsertFluxValue(this,uVar8);
          bVar2 = false;
        }
        this->stream_position_ = this->stream_position_ + 1;
        fread(&local_43,1,1,__stream);
        bVar9 = local_43;
      } while (this->finished_ != true);
    }
    fclose(__stream);
    ppIVar5 = local_38;
    uVar4 = local_3c;
    uVar8 = local_40;
    ComputeTrack(this,local_38,local_40,local_3c);
    (*(*ppIVar5)->_vptr_IDisk[0x13])(*ppIVar5,(ulong)uVar8,(ulong)uVar4);
    iVar7 = 0;
    if (this->flux_list_ != (FluxElement *)0x0) {
      operator_delete__(this->flux_list_);
    }
  }
  return iVar7;
}

Assistant:

int FormatTypeRAW::LoadTrack(IDisk*& created_disk, const char* file_path, int side, int track)
{
   FILE* file;

   unsigned char h; // byte header

   unsigned int flux_value = 0;
   last_stream_index_position_ = 0;
   finished_ = false;

   if (fopen_s(&file, file_path, "rb") == 0)
   {
      bool overflow = false;
      stream_position_ = 0;
      size_of_flux_value_ = DEFAULT_FLUX_SIZE;

      flux_list_ = new FluxElement[size_of_flux_value_];
      nb_flux_value_ = 0;
      index_list_.clear();

      // Next byte header
      h = Get(file);

      while (!finished_ && !feof(file))
      {
         // decode
         switch (h)
         {
         case 0x0A:
            Get(file); // Skip this byte
         case 0x09:
            Get(file); // Skip this byte
         case 0x08:
            ; // Nothing : Skip header byte
            break;
         case 0x0B:
            // Overflow
            flux_value += 0x10000;
            overflow = true;
            break;
         case 0x0C:
            {
               if (!overflow) flux_value = 0;

               unsigned char h1 = Get(file);
               unsigned char h2 = Get(file);
               flux_value += (h1 << 8) + h2;
               InsertFluxValue(flux_value);
               overflow = false;
               break;
            }
         case 0x0D:
            --stream_position_;
            HandleOOB(file);
            break;
         case 0:
         case 1:
         case 2:
         case 3:
         case 4:
         case 5:
         case 6:
         case 7: // Flux 2
            {
               if (!overflow) flux_value = 0;

               unsigned char h1 = Get(file);
               flux_value += ((h << 8) + h1);
               InsertFluxValue(flux_value);
               overflow = false;
               break;
            }
         default: // Flux 1
            if (!overflow) flux_value = 0;

            flux_value += h;
            InsertFluxValue(flux_value);
            overflow = false;
            break;
         }

         // Next byte header
         h = Get(file);
      }

      fclose(file);

      // Compute datas
      ComputeTrack(created_disk, side, track);
      created_disk->CreateSingleTrackFromMultiRevolutions(side, track);

      delete[]flux_list_;
   }
   else
   {
      return -1;
   }

   return 0;
}